

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostDetailsProvider.cpp
# Opt level: O3

HostDetails * __thiscall
FIX::HostDetailsProvider::getHost
          (HostDetails *__return_storage_ptr__,HostDetailsProvider *this,SessionID *s,Dictionary *d)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  long lVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  _Any_data *this_00;
  Dictionary *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>,_bool>
  pVar8;
  string hostSelectionPolicy;
  string local_98;
  Dictionary *local_78;
  _Any_data *local_70;
  size_t local_68;
  _Any_data local_60;
  string local_50;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60._M_pod_data[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"HostSelectionPolicy","");
  bVar1 = Dictionary::has(d,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_78 = d;
  if (bVar1) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"HostSelectionPolicy","");
    Dictionary::getString(&local_98,d,&local_50,false);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (_Any_data *)&this->m_sessionToLastConnectionAttempt;
  iVar3 = std::
          _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>_>
          ::find((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>_>
                  *)this_00,s);
  if ((this->getTime).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar6 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(local_60._1_7_,local_60._M_pod_data[0]) + 1);
    }
    _Unwind_Resume(uVar6);
  }
  _Var7._M_p = (pointer)this;
  p_Var4 = (_Base_ptr)(*(this->getTime)._M_invoker)((_Any_data *)this);
  this_01 = local_78;
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->m_sessionToLastConnectionAttempt)._M_t._M_impl.super__Rb_tree_header) {
    local_98._M_dataplus._M_p = local_98._M_dataplus._M_p & 0xffffffff00000000;
    local_98._M_string_length = (size_type)p_Var4;
    pVar8 = std::
            _Rb_tree<FIX::SessionID,std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>,std::_Select1st<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>,std::less<FIX::SessionID>,std::allocator<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>>
            ::
            _M_emplace_unique<FIX::SessionID_const&,FIX::HostDetailsProvider::LastConnectionAttempt>
                      ((_Rb_tree<FIX::SessionID,std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>,std::_Select1st<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>,std::less<FIX::SessionID>,std::allocator<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>>
                        *)this_00->_M_pod_data,s,(LastConnectionAttempt *)&local_98);
    iVar3._M_node = (_Base_ptr)pVar8.first._M_node;
    this_01 = local_78;
    goto LAB_00178b60;
  }
  if ((local_68 == HOST_SELECTION_POLICY_PRIORITY_abi_cxx11_._M_string_length) &&
     ((local_68 == 0 ||
      (_Var7._M_p = (pointer)local_70,
      iVar2 = bcmp(local_70,HOST_SELECTION_POLICY_PRIORITY_abi_cxx11_._M_dataplus._M_p,local_68),
      iVar2 == 0)))) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"HostSelectionPolicyPriorityStartOverInterval","");
    bVar1 = Dictionary::has(this_01,&local_98);
    _Var7._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    lVar5 = 0x78;
    if (bVar1) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"HostSelectionPolicyPriorityStartOverInterval","");
      iVar2 = Dictionary::getInt(local_78,&local_98);
      _Var7._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      lVar5 = (long)iVar2;
    }
    this_01 = local_78;
    if ((long)p_Var4 - (long)iVar3._M_node[0xb]._M_right < lVar5) goto LAB_00178b30;
    *(undefined4 *)&iVar3._M_node[0xb]._M_left = 0;
  }
  else {
LAB_00178b30:
    *(int *)&iVar3._M_node[0xb]._M_left = *(int *)&iVar3._M_node[0xb]._M_left + 1;
  }
  iVar3._M_node[0xb]._M_right = p_Var4;
  this_00 = (_Any_data *)_Var7._M_p;
LAB_00178b60:
  (__return_storage_ptr__->address)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->address).field_2;
  (__return_storage_ptr__->address)._M_string_length = 0;
  (__return_storage_ptr__->address).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->port = 0;
  (__return_storage_ptr__->sourceAddress)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->sourceAddress).field_2;
  (__return_storage_ptr__->sourceAddress)._M_string_length = 0;
  (__return_storage_ptr__->sourceAddress).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->sourcePort = 0;
  bVar1 = populateHostDetails((HostDetailsProvider *)this_00,*(int *)&iVar3._M_node[0xb]._M_left,
                              this_01,__return_storage_ptr__);
  if (!bVar1) {
    populateHostDetails((HostDetailsProvider *)this_00,0,this_01,__return_storage_ptr__);
    *(undefined4 *)&iVar3._M_node[0xb]._M_left = 0;
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(local_60._1_7_,local_60._M_pod_data[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FIX::HostDetails FIX::HostDetailsProvider::getHost(const SessionID &s, const Dictionary &d) {
  std::string hostSelectionPolicy;
  if (d.has(HOST_SELECTION_POLICY)) {
    hostSelectionPolicy = d.getString(HOST_SELECTION_POLICY);
  }

  auto sessionIt = m_sessionToLastConnectionAttempt.find(s);

  time_t now = getTime();

  if (sessionIt == m_sessionToLastConnectionAttempt.end()) {
    auto result = m_sessionToLastConnectionAttempt.emplace(s, LastConnectionAttempt{0, now});
    sessionIt = result.first;
  } else {
    if (hostSelectionPolicy == HOST_SELECTION_POLICY_PRIORITY) {
      int startOverInterval = 120;
      if (d.has(HOST_SELECTION_POLICY_PRIORITY_START_OVER_INTERVAL)) {
        startOverInterval = d.getInt(HOST_SELECTION_POLICY_PRIORITY_START_OVER_INTERVAL);
      }

      if ((now - sessionIt->second.time >= startOverInterval)) {
        sessionIt->second.hostNumber = 0;
        sessionIt->second.time = now;
      } else {
        ++sessionIt->second.hostNumber;
        sessionIt->second.time = now;
      }
    } else {
      ++sessionIt->second.hostNumber;
      sessionIt->second.time = now;
    }
  }

  HostDetails details;
  bool isDefinedInSettings = populateHostDetails(sessionIt->second.hostNumber, d, details);

  if (!isDefinedInSettings) {
    populateHostDetails(0, d, details);
    sessionIt->second.hostNumber = 0;
  }

  return details;
}